

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

vector<cmTarget_*,_std::allocator<cmTarget_*>_> * __thiscall
cmMakefile::GetImportedTargets
          (vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__return_storage_ptr__,cmMakefile *this)

{
  __node_base *p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::reserve
            (__return_storage_ptr__,(this->ImportedTargets)._M_h._M_element_count);
  p_Var1 = &(this->ImportedTargets)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back
              (__return_storage_ptr__,(value_type *)(p_Var1 + 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmTarget*> cmMakefile::GetImportedTargets() const
{
  std::vector<cmTarget*> tgts;
  tgts.reserve(this->ImportedTargets.size());
  for (TargetMap::const_iterator it = this->ImportedTargets.begin();
       it != this->ImportedTargets.end(); ++it) {
    tgts.push_back(it->second);
  }
  return tgts;
}